

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::TraverseSchema::traverseComplexTypeDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel,XMLCh *recursingTypeName)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  uint uVar3;
  SchemaInfo *pSVar4;
  XMLStringPool *pXVar5;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar6;
  ValueVectorOf<unsigned_int> *this_01;
  XMLSize_t XVar7;
  ComplexTypeInfo *pCVar8;
  Janitor<xercesc_4_0::XSAnnotation> annotation;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  XMLCh *pXVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar18;
  ComplexTypeInfo *this_02;
  XSDLocator *this_03;
  undefined4 extraout_var_01;
  DOMElement *pDVar19;
  DOMNode *node;
  XSAnnotation *pXVar20;
  XMLCh *pXVar21;
  short *psVar22;
  short *psVar23;
  long lVar24;
  short *psVar25;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar26;
  XMLSize_t XVar27;
  XMLCh XVar28;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  NamespaceScopeManager nsMgr;
  XMLCh *pXVar17;
  undefined4 extraout_var_02;
  
  pSVar4 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    nsMgr.fScopeAdded = false;
  }
  else {
    nsMgr.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  nsMgr.fSchemaInfo = pSVar4;
  pXVar16 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((pXVar16 == (XMLCh *)0x0) || (*pXVar16 == L'\0')) {
    if (topLevel) {
      uVar12 = 0xffffffff;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0xe);
      goto LAB_003307df;
    }
    if (recursingTypeName == (XMLCh *)0x0) {
      uVar12 = this->fAnonXSTypeCount;
      this->fAnonXSTypeCount = uVar12 + 1;
      XMLString::sizeToText((ulong)uVar12,(XMLCh *)&janAnnot,0xf,10,this->fMemoryManager);
      (this->fBuffer).fIndex = 0;
      XMLBuffer::append(&this->fBuffer,(XMLCh *)fgAnonCNamePrefix);
      XMLBuffer::append(&this->fBuffer,(XMLCh *)&janAnnot);
      pXVar5 = this->fStringPool;
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
      iVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5);
      pXVar16 = (XMLCh *)CONCAT44(extraout_var,iVar13);
      bVar11 = true;
    }
    else {
      bVar11 = false;
      pXVar16 = recursingTypeName;
    }
  }
  else {
    bVar11 = false;
  }
  XVar27 = 0;
  if (pXVar16 != (XMLCh *)0x0) {
    do {
      psVar22 = (short *)((long)pXVar16 + XVar27);
      XVar27 = XVar27 + 2;
    } while (*psVar22 != 0);
    XVar27 = ((long)XVar27 >> 1) - 1;
  }
  bVar9 = XMLChar1_0::isValidNCName(pXVar16,XVar27);
  if (!bVar9) {
    uVar12 = 0xffffffff;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"complexType",
                      pXVar16,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_003307df;
  }
  this_00 = &this->fBuffer;
  pXVar17 = this->fTargetNSURIString;
  (this->fBuffer).fIndex = 0;
  if ((pXVar17 != (XMLCh *)0x0) && (*pXVar17 != L'\0')) {
    XMLBuffer::append(this_00,pXVar17);
  }
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar27 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar27 + 1;
  (this->fBuffer).fBuffer[XVar27] = L',';
  XMLBuffer::append(this_00,pXVar16);
  pXVar5 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  uVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])();
  iVar13 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
  pXVar17 = (XMLCh *)CONCAT44(extraout_var_00,iVar13);
  if (recursingTypeName == (XMLCh *)0x0 && !topLevel) {
LAB_003302c1:
    this_02 = (ComplexTypeInfo *)0x0;
  }
  else {
    pRVar6 = this->fComplexTypeRegistry;
    if ((pXVar17 == (XMLCh *)0x0) || (uVar18 = (ulong)(ushort)*pXVar17, uVar18 == 0)) {
      uVar18 = 0;
    }
    else {
      XVar28 = pXVar17[1];
      if (XVar28 != L'\0') {
        pXVar21 = pXVar17 + 2;
        do {
          uVar18 = (ulong)(ushort)XVar28 + (uVar18 >> 0x18) + uVar18 * 0x26;
          XVar28 = *pXVar21;
          pXVar21 = pXVar21 + 1;
        } while (XVar28 != L'\0');
      }
      uVar18 = uVar18 % pRVar6->fHashModulus;
    }
    pRVar26 = pRVar6->fBucketList[uVar18];
    if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar9 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,pXVar17,pRVar26->fKey);
        if (bVar9) goto LAB_0033029e;
        pRVar26 = pRVar26->fNext;
      } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    pRVar26 = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0;
LAB_0033029e:
    if (pRVar26 == (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      this_02 = (ComplexTypeInfo *)0x0;
    }
    else {
      this_02 = pRVar26->fData;
    }
    if (this_02 == (ComplexTypeInfo *)0x0) goto LAB_003302c1;
    if (this_02->fPreprocessed == false) goto LAB_003307df;
  }
  if (this_02 == (ComplexTypeInfo *)0x0) {
    bVar10 = 0;
  }
  else {
    bVar10 = this_02->fPreprocessed;
  }
  if (bVar10 == 0) {
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,elem,topLevel ^ 0xd,this,topLevel,this->fNonXSAttList);
  }
  XVar27 = this->fCircularCheckIndex;
  uVar3 = this->fCurrentScope;
  if (bVar10 == 0) {
    this_02 = (ComplexTypeInfo *)XMemory::operator_new(0xb0,this->fGrammarPoolMemoryManager);
    ComplexTypeInfo::ComplexTypeInfo(this_02,this->fGrammarPoolMemoryManager);
    if (bVar11) {
      this_02->fAnonymous = true;
    }
    uVar14 = this->fScopeCount;
    this->fScopeCount = uVar14 + 1;
    this->fCurrentScope = uVar14;
    RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::put
              (this->fComplexTypeRegistry,pXVar17,this_02);
    ComplexTypeInfo::setTypeName(this_02,pXVar17);
    this_02->fScopeDefined = this->fCurrentScope;
    if (this->fFullConstraintChecking == true) {
      this_03 = (XSDLocator *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
      XSDLocator::XSDLocator(this_03);
      pXVar5 = this->fStringPool;
      uVar14 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])
                         (pXVar5,this->fSchemaInfo->fCurrentSchemaURL);
      iVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar14);
      XSDLocator::setValues
                (this_03,(XMLCh *)CONCAT44(extraout_var_01,iVar13),(XMLCh *)0x0,
                 (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
                 (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
      ComplexTypeInfo::setLocator(this_02,this_03);
    }
  }
  else {
    this->fCurrentScope = this_02->fScopeDefined;
    this_02->fPreprocessed = false;
  }
  this_01 = this->fCurrentTypeNameStack;
  ValueVectorOf<unsigned_int>::ensureExtraCapacity(this_01,1);
  XVar7 = this_01->fCurCount;
  this_01->fCurCount = XVar7 + 1;
  this_01->fElemList[XVar7] = uVar12;
  pCVar8 = this->fCurrentComplexType;
  this->fCurrentComplexType = this_02;
  pDVar19 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  node = &checkContent(this,elem,pDVar19,true,(bool)(bVar10 ^ 1))->super_DOMNode;
  if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
      (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
    pXVar20 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
    this->fAnnotation = pXVar20;
  }
  janAnnot.fData = this->fAnnotation;
  pXVar21 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_MIXED,Boolean);
  if ((pXVar21 == (XMLCh *)0x0) || (*pXVar21 == L'\0')) {
LAB_0033053a:
    bVar11 = false;
  }
  else {
    if (pXVar21 != L"true") {
      lVar24 = 0;
      do {
        psVar22 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar24);
        if (*psVar22 == 0) {
          if ((pXVar21 == L"1") || (*(short *)((long)pXVar21 + lVar24) == 0)) goto LAB_0033053e;
          goto LAB_00330512;
        }
        psVar23 = (short *)((long)pXVar21 + lVar24);
        lVar24 = lVar24 + 2;
      } while (*psVar22 == *psVar23);
      if (pXVar21 != L"1") {
LAB_00330512:
        lVar24 = 0;
        do {
          psVar22 = (short *)((long)&fgValueOne + lVar24);
          if (*psVar22 == 0) {
            if (pXVar21[1] == L'\0') goto LAB_0033053e;
            break;
          }
          psVar23 = (short *)((long)pXVar21 + lVar24);
          lVar24 = lVar24 + 2;
        } while (*psVar22 == *psVar23);
        goto LAB_0033053a;
      }
    }
LAB_0033053e:
    bVar11 = true;
  }
  if (node == (DOMNode *)0x0) {
    processComplexContent(this,elem,pXVar16,(DOMElement *)0x0,this_02,(XMLCh *)0x0,bVar11,false);
  }
  else {
    iVar13 = (*node->_vptr_DOMNode[0x18])(node);
    psVar22 = (short *)CONCAT44(extraout_var_02,iVar13);
    if (psVar22 == &SchemaSymbols::fgELT_SIMPLECONTENT) {
LAB_003305e6:
      traverseSimpleContentDecl(this,pXVar16,pXVar17,(DOMElement *)node,this_02,&janAnnot);
      pDVar19 = XUtil::getNextSiblingElement(node);
      iVar13 = 0x2d;
    }
    else {
      psVar23 = &SchemaSymbols::fgELT_SIMPLECONTENT;
      psVar25 = psVar22;
      if (psVar22 == (short *)0x0) {
LAB_003305b1:
        if (*psVar23 == 0) goto LAB_003305e6;
      }
      else {
        do {
          sVar1 = *psVar25;
          if (sVar1 == 0) goto LAB_003305b1;
          sVar2 = *psVar23;
          psVar23 = psVar23 + 1;
          psVar25 = psVar25 + 1;
        } while (sVar1 == sVar2);
      }
      if (psVar22 != &SchemaSymbols::fgELT_COMPLEXCONTENT) {
        psVar23 = &SchemaSymbols::fgELT_COMPLEXCONTENT;
        if (psVar22 == (short *)0x0) {
LAB_0033060e:
          if (*psVar23 == 0) goto LAB_00330629;
        }
        else {
          do {
            sVar1 = *psVar22;
            if (sVar1 == 0) goto LAB_0033060e;
            psVar22 = psVar22 + 1;
            sVar2 = *psVar23;
            psVar23 = psVar23 + 1;
          } while (sVar1 == sVar2);
        }
        if (this->fCurrentGroupInfo == (XercesGroupInfo *)0x0) {
          processComplexContent
                    (this,elem,pXVar16,(DOMElement *)node,this_02,(XMLCh *)0x0,bVar11,false);
        }
        else {
          this_02->fPreprocessed = true;
        }
        goto LAB_00330669;
      }
LAB_00330629:
      traverseComplexContentDecl(this,pXVar16,(DOMElement *)node,this_02,bVar11,&janAnnot);
      pDVar19 = XUtil::getNextSiblingElement(node);
      iVar13 = 0x2e;
    }
    if (pDVar19 != (DOMElement *)0x0) {
      reportSchemaError(this,(DOMElement *)node,L"http://apache.org/xml/messages/XMLErrors",iVar13);
    }
  }
LAB_00330669:
  if (bVar10 == 0) {
    pXVar16 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
    iVar13 = parseBlockSet(this,elem,1,false);
    iVar15 = parseFinalSet(this,elem,3,false);
    this_02->fBlockSet = iVar13;
    this_02->fFinalSet = iVar15;
    if ((pXVar16 == (XMLCh *)0x0) || (*pXVar16 == L'\0')) {
LAB_00330772:
      bVar11 = false;
    }
    else {
      bVar11 = true;
      if (pXVar16 != L"true") {
        lVar24 = 0;
        do {
          psVar22 = (short *)((long)pXVar16 + lVar24);
          if (*psVar22 == 0) {
            if ((pXVar16 == L"1") || (*(short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar24) == 0)
               ) goto LAB_00330774;
            goto LAB_00330721;
          }
          psVar23 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar24);
          lVar24 = lVar24 + 2;
        } while (*psVar22 == *psVar23);
        if (pXVar16 != L"1") {
LAB_00330721:
          lVar24 = 0;
          do {
            psVar22 = (short *)((long)pXVar16 + lVar24);
            if (*psVar22 == 0) {
              if (*(short *)((long)&fgValueOne + lVar24) == 0) goto LAB_00330774;
              break;
            }
            psVar23 = (short *)((long)&fgValueOne + lVar24);
            lVar24 = lVar24 + 2;
          } while (*psVar22 == *psVar23);
          goto LAB_00330772;
        }
      }
    }
LAB_00330774:
    this_02->fAbstract = bVar11;
  }
  annotation.fData = janAnnot.fData;
  if (janAnnot.fData != (XSAnnotation *)0x0) {
    janAnnot.fData = (XSAnnotation *)0x0;
    SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_02,annotation.fData);
  }
  XVar7 = this->fCurrentTypeNameStack->fCurCount;
  if (XVar7 != 0) {
    ValueVectorOf<unsigned_int>::removeElementAt(this->fCurrentTypeNameStack,XVar7 - 1);
  }
  this->fCircularCheckIndex = XVar27;
  this->fCurrentScope = uVar3;
  this->fCurrentComplexType = pCVar8;
  if (janAnnot.fData != (XSAnnotation *)0x0) {
    (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[1])();
  }
LAB_003307df:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return uVar12;
}

Assistant:

int TraverseSchema::traverseComplexTypeDecl(const DOMElement* const elem,
                                            const bool topLevel,
                                            const XMLCh* const recursingTypeName) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // Get the attributes of the complexType
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool isAnonymous = false;

    if (!name || !*name) {

        if (topLevel) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameComplexType);
            return -1;
        }

        if (recursingTypeName)
            name = recursingTypeName;
        else {
            name = genAnonTypeName(fgAnonCNamePrefix);
            isAnonymous = true;
        }
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)) ) {

        //REVISIT - Should we return or continue and save type with wrong name?
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_COMPLEXTYPE, name);
        return -1;
    }

    // ------------------------------------------------------------------
    // Check if the type has already been registered
    // ------------------------------------------------------------------
    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(name);

    int typeNameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* fullName = fStringPool->getValueForId(typeNameIndex);
    ComplexTypeInfo* typeInfo = 0;

    if (topLevel || recursingTypeName) {

        typeInfo = fComplexTypeRegistry->get(fullName);

        if (typeInfo && !typeInfo->getPreprocessed()) {
            return typeNameIndex;
        }
    }

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    bool preProcessFlag = (typeInfo) ? typeInfo->getPreprocessed() : false;
    if (!preProcessFlag) {
        fAttributeCheck.checkAttributes(
            elem, (topLevel) ? GeneralAttributeCheck::E_ComplexTypeGlobal
                             : GeneralAttributeCheck::E_ComplexTypeLocal
            , this, topLevel, fNonXSAttList
        );
    }

    // -----------------------------------------------------------------------
    // Create a new instance
    // -----------------------------------------------------------------------
    XMLSize_t previousCircularCheckIndex = fCircularCheckIndex;
    unsigned int previousScope = fCurrentScope;

    if (preProcessFlag) {

        fCurrentScope = typeInfo->getScopeDefined();
        typeInfo->setPreprocessed(false);
    }
    else {

        // ------------------------------------------------------------------
        // Register the type
        // ------------------------------------------------------------------
        typeInfo = new (fGrammarPoolMemoryManager) ComplexTypeInfo(fGrammarPoolMemoryManager);
        if(isAnonymous) {
            typeInfo->setAnonymous();
        }

        fCurrentScope = fScopeCount++;
        fComplexTypeRegistry->put((void*) fullName, typeInfo);
        typeInfo->setTypeName(fullName);
        typeInfo->setScopeDefined(fCurrentScope);

        if (fFullConstraintChecking) {

            XSDLocator* aLocator = new (fGrammarPoolMemoryManager) XSDLocator();
            aLocator->setValues(fStringPool->getValueForId(fStringPool->addOrFind(fSchemaInfo->getCurrentSchemaURL())),
                                0, ((XSDElementNSImpl*) elem)->getLineNo(),
                                ((XSDElementNSImpl*) elem)->getColumnNo());
            typeInfo->setLocator(aLocator);
        }
    }

    fCurrentTypeNameStack->addElement(typeNameIndex);
    ComplexTypeInfo* saveTypeInfo = fCurrentComplexType;
    fCurrentComplexType = typeInfo;

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration and get next child
    // ------------------------------------------------------------------
    DOMElement* child = checkContent(elem, XUtil::getFirstChildElement(elem), true, !preProcessFlag);

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Process the content of the complex type declaration
    // ------------------------------------------------------------------
    try {

        const XMLCh* mixedVal = getElementAttValue(elem,SchemaSymbols::fgATT_MIXED, DatatypeValidator::Boolean);
        bool isMixed = false;

        if ((mixedVal && *mixedVal)
            && (XMLString::equals(SchemaSymbols::fgATTVAL_TRUE, mixedVal)
                || XMLString::equals(fgValueOne, mixedVal))) {
            isMixed = true;
        }

        if (child == 0) {
            // EMPTY complexType with complexContent
            processComplexContent(elem, name, child, typeInfo, 0, isMixed);
        }
        else {

            const XMLCh* childName = child->getLocalName();

            if (XMLString::equals(childName, SchemaSymbols::fgELT_SIMPLECONTENT)) {

                // SIMPLE CONTENT element
                traverseSimpleContentDecl(name, fullName, child, typeInfo, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingSimpleContent);
                }
            }
            else if (XMLString::equals(childName, SchemaSymbols::fgELT_COMPLEXCONTENT)) {

                // COMPLEX CONTENT element
                traverseComplexContentDecl(name, child, typeInfo, isMixed, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingConplexContent);
                }
            }
            else if (fCurrentGroupInfo) {
                typeInfo->setPreprocessed(true);
            }
            else {
                // We must have ....
                // GROUP, ALL, SEQUENCE or CHOICE, followed by optional attributes
                // Note that it's possible that only attributes are specified.
                processComplexContent(elem, name, child, typeInfo, 0, isMixed);
            }
        }
    }
    catch(const TraverseSchema::ExceptionCodes aCode) {
        if (aCode == TraverseSchema::InvalidComplexTypeInfo)
            defaultComplexTypeInfo(typeInfo);
        else if (aCode == TraverseSchema::RecursingElement)
            typeInfo->setPreprocessed();
    }

    // ------------------------------------------------------------------
    // Finish the setup of the typeInfo
    // ------------------------------------------------------------------
    if (!preProcessFlag) {

        const XMLCh* abstractAttVal = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        int blockSet = parseBlockSet(elem, C_Block);
        int finalSet = parseFinalSet(elem, EC_Final);

        typeInfo->setBlockSet(blockSet);
        typeInfo->setFinalSet(finalSet);

        if ((abstractAttVal && *abstractAttVal)
            && (XMLString::equals(abstractAttVal, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(abstractAttVal, fgValueOne))) {
            typeInfo->setAbstract(true);
        }
        else {
            typeInfo->setAbstract(false);
        }
    }

    // Store Annotation
    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(typeInfo, janAnnot.release());

    // ------------------------------------------------------------------
    // Before exiting, restore the scope, mainly for nested anonymous types
    // ------------------------------------------------------------------
    popCurrentTypeNameStack();
    fCircularCheckIndex = previousCircularCheckIndex;
    fCurrentScope = previousScope;
    fCurrentComplexType = saveTypeInfo;

    return typeNameIndex;
}